

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseTest.cpp
# Opt level: O2

void __thiscall BaseTest::solve<KruskalMST>(BaseTest *this,char *info)

{
  ostream *poVar1;
  long lVar2;
  double dVar3;
  rep time;
  double ans;
  KruskalMST solver;
  long local_50;
  double local_48;
  char *local_40;
  KruskalMST local_38;
  
  local_40 = info;
  poVar1 = std::operator<<((ostream *)&std::cout,info);
  std::endl<char,std::char_traits<char>>(poVar1);
  lVar2 = std::chrono::_V2::system_clock::now();
  KruskalMST::KruskalMST(&local_38,&this->input);
  dVar3 = KruskalMST::operator()(&local_38);
  local_48 = dVar3;
  local_50 = std::chrono::_V2::system_clock::now();
  local_50 = local_50 - lVar2;
  poVar1 = std::operator<<((ostream *)&std::cout,"use time : ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<(poVar1,"result : ");
  poVar1 = std::ostream::_M_insert<double>(dVar3);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::vector<BaseTest::Result,std::allocator<BaseTest::Result>>::
  emplace_back<char_const*&,double&,long&>
            ((vector<BaseTest::Result,std::allocator<BaseTest::Result>> *)&this->results,&local_40,
             &local_48,&local_50);
  std::_Vector_base<KruskalMST::Edge,_std::allocator<KruskalMST::Edge>_>::~_Vector_base
            ((_Vector_base<KruskalMST::Edge,_std::allocator<KruskalMST::Edge>_> *)&local_38);
  return;
}

Assistant:

void BaseTest::solve(const char *info)
{
	std::cout << info << std::endl;
	auto beg = now();
	MSTSolver solver(input);
	double ans = solver();
	auto time = (now() - beg).count();
	std::cout << "use time : " << time << std::endl
	          << "result : " << ans << std::endl
	          << std::endl;
	results.emplace_back(info, ans, time);
}